

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

int __thiscall
lossless_neural_sound::expression_compiler::expression::Element_variable::
structurally_compare_implementation(Element_variable *this,Expression_node *rt)

{
  _func_int **pp_Var1;
  Node *pNVar2;
  Node *pNVar3;
  uint in_EAX;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  if (rt == (Expression_node *)0x0) {
    __assert_fail("rt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                  ,0x31a,
                  "virtual int lossless_neural_sound::expression_compiler::expression::Element_variable::structurally_compare_implementation(const Expression_node *) const"
                 );
  }
  pp_Var1 = (rt->super_Node)._vptr_Node;
  if (pp_Var1 == (_func_int **)&PTR__Node_00127c20) {
    iVar4 = std::__cxx11::string::compare((string *)&this->matrix_variable->name);
    if (iVar4 < 0) {
LAB_0011d9d7:
      in_EAX = 0xffffffff;
    }
    else if (iVar4 == 0) {
      lVar6 = 0;
      do {
        pNVar2 = (&rt[1].super_Node.hash_next)[lVar6];
        pNVar3 = (Node *)(this->indexes)._M_elems[lVar6];
        if (pNVar3 < pNVar2) goto LAB_0011d9d7;
        if (pNVar3 >= pNVar2 && pNVar3 != pNVar2) goto LAB_0011d9b3;
        lVar6 = lVar6 + 1;
        in_EAX = 0;
      } while (lVar6 == 1);
    }
    else {
LAB_0011d9b3:
      in_EAX = 1;
    }
  }
  if (pp_Var1 != (_func_int **)&PTR__Node_00127c20) {
    uVar5 = (*(rt->super_Node)._vptr_Node[6])(rt);
    in_EAX = 0xffffffff;
    if (uVar5 < 2) {
      in_EAX = (uint)(uVar5 == 0);
    }
  }
  return in_EAX;
}

Assistant:

virtual int structurally_compare_implementation(const Expression_node *rt) const
        noexcept override
    {
        assert(rt);
        if(auto *variable = dynamic_cast<const Element_variable *>(rt))
        {
            int name_compare = matrix_variable->name.compare(variable->matrix_variable->name);
            if(name_compare < 0)
                return -1;
            if(name_compare > 0)
                return 1;
            for(std::size_t i = 0; i < indexes.size(); i++)
            {
                if(indexes[i] < variable->indexes[i])
                    return -1;
                if(indexes[i] > variable->indexes[i])
                    return 1;
            }
            return 0;
        }
        auto rt_kind = rt->get_kind();
        if(Kind::Element_variable < rt_kind)
            return -1;
        if(Kind::Element_variable > rt_kind)
            return 1;
        return 0;
    }